

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::ThingImpl::intercept(ThingImpl *this,InterceptContext context)

{
  long *in_RDX;
  PointerBuilder local_98;
  undefined1 local_78;
  SegmentBuilder *local_60;
  CapTableBuilder *pCStack_58;
  WirePointer *local_50;
  StructBuilder local_48;
  
  local_78 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_60);
  local_98.pointer = local_50;
  local_98.segment = local_60;
  local_98.capTable = pCStack_58;
  PointerBuilder::getStruct(&local_48,&local_98,(StructSize)0x10000,(word *)0x0);
  local_98.segment = local_48.segment;
  local_98.capTable = local_48.capTable;
  local_98.pointer = local_48.pointers;
  PointerBuilder::setBlob<capnp::Text>
            (&local_98,(StringPtr)*(StringPtr *)&context.hook[1]._vptr_CallContextHook);
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> intercept(InterceptContext context) override {
    context.getResults().setText(text);
    return kj::READY_NOW;
  }